

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall bssl::anon_unknown_0::QUICMethodTest::QUICMethodTest(QUICMethodTest *this)

{
  undefined8 in_RAX;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__QUICMethodTest_00409a18;
  (this->server_)._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (ssl_st *)0x0;
  (this->client_ctx_)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl = (ssl_ctx_st *)0x0;
  (this->server_ctx_)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl = (ssl_ctx_st *)0x0;
  (this->transport_)._M_t.
  super___uniq_ptr_impl<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
  ._M_t.
  super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
  .super__Head_base<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_false>._M_head_impl =
       (MockQUICTransportPair *)0x0;
  (this->client_)._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (ssl_st *)0x0;
  uStack_38 = CONCAT17(1,(undefined7)uStack_38);
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&uStack_38 + 7);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->server_transport_params_,__l,(allocator_type *)((long)&uStack_38 + 6));
  uStack_38._0_6_ = CONCAT15(2,(undefined5)uStack_38);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)((long)&uStack_38 + 5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->server_quic_early_data_context_,__l_00,(allocator_type *)((long)&uStack_38 + 4))
  ;
  this->allow_out_of_order_writes_ = false;
  return;
}

Assistant:

void SetUp() override {
    client_ctx_.reset(SSL_CTX_new(TLS_method()));
    server_ctx_ = CreateContextWithTestCertificate(TLS_method());
    ASSERT_TRUE(client_ctx_);
    ASSERT_TRUE(server_ctx_);

    SSL_CTX_set_min_proto_version(server_ctx_.get(), TLS1_3_VERSION);
    SSL_CTX_set_max_proto_version(server_ctx_.get(), TLS1_3_VERSION);
    SSL_CTX_set_min_proto_version(client_ctx_.get(), TLS1_3_VERSION);
    SSL_CTX_set_max_proto_version(client_ctx_.get(), TLS1_3_VERSION);

    static const uint8_t kALPNProtos[] = {0x03, 'f', 'o', 'o'};
    ASSERT_EQ(SSL_CTX_set_alpn_protos(client_ctx_.get(), kALPNProtos,
                                      sizeof(kALPNProtos)),
              0);
    SSL_CTX_set_alpn_select_cb(
        server_ctx_.get(),
        [](SSL *ssl, const uint8_t **out, uint8_t *out_len, const uint8_t *in,
           unsigned in_len, void *arg) -> int {
          return SSL_select_next_proto(
                     const_cast<uint8_t **>(out), out_len, in, in_len,
                     kALPNProtos, sizeof(kALPNProtos)) == OPENSSL_NPN_NEGOTIATED
                     ? SSL_TLSEXT_ERR_OK
                     : SSL_TLSEXT_ERR_NOACK;
        },
        nullptr);
  }